

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

string * __thiscall
ast::ReturnStmt::toString_abi_cxx11_(string *__return_storage_ptr__,ReturnStmt *this)

{
  ostringstream msg;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,"return ");
  operator<<((ostream *)local_190,this->returnValue);
  std::endl<char,std::char_traits<char>>((ostream *)local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string ast::ReturnStmt::toString() const {
    std::ostringstream msg;
    msg << "return ";
    msg << returnValue;
    msg << std::endl;
    return msg.str();
}